

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

QJsonObject __thiscall QJsonValue::toObject(QJsonValue *this,QJsonObject *defaultValue)

{
  Type TVar1;
  QJsonObject *in_RDX;
  
  TVar1 = convertFromCborType(*(Type *)&defaultValue[2].o.d.ptr);
  if (TVar1 == Object) {
    QJsonObject::QJsonObject
              ((QJsonObject *)this,
               (QCborContainerPrivate *)
               ((long)(defaultValue->o).d.ptr >> 0x3f & (ulong)defaultValue[1].o.d.ptr));
  }
  else {
    QJsonObject::QJsonObject((QJsonObject *)this,in_RDX);
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QJsonObject QJsonValue::toObject(const QJsonObject &defaultValue) const
{
    if (!isObject())
        return defaultValue;
    QCborContainerPrivate *dd = nullptr;
    const auto container = QJsonPrivate::Value::container(value);
    const auto n = QJsonPrivate::Value::valueHelper(value);
    Q_ASSERT(n == -1 || container == nullptr);
    if (n < 0)
        dd = container;
    return QJsonObject(dd);
}